

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_newline.c
# Opt level: O0

BOOL coda__pcre2_is_newline_8
               (PCRE2_SPTR8 ptr,uint32_t type,PCRE2_SPTR8 endptr,uint32_t *lenptr,BOOL utf)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t c;
  BOOL utf_local;
  uint32_t *lenptr_local;
  PCRE2_SPTR8 endptr_local;
  uint32_t type_local;
  PCRE2_SPTR8 ptr_local;
  
  uVar1 = (uint)*ptr;
  if (type == 2) {
    if (uVar1 == 10) {
      *lenptr = 1;
      ptr_local._4_4_ = 1;
    }
    else if (uVar1 == 0xd) {
      bVar3 = false;
      if (ptr < endptr + -1) {
        bVar3 = ptr[1] == '\n';
      }
      uVar2 = 1;
      if (bVar3) {
        uVar2 = 2;
      }
      *lenptr = uVar2;
      ptr_local._4_4_ = 1;
    }
    else {
      ptr_local._4_4_ = 0;
    }
  }
  else if (uVar1 - 10 < 3) {
    *lenptr = 1;
    ptr_local._4_4_ = 1;
  }
  else if (uVar1 == 0xd) {
    bVar3 = false;
    if (ptr < endptr + -1) {
      bVar3 = ptr[1] == '\n';
    }
    uVar2 = 1;
    if (bVar3) {
      uVar2 = 2;
    }
    *lenptr = uVar2;
    ptr_local._4_4_ = 1;
  }
  else if (uVar1 == 0x85) {
    uVar2 = 1;
    if (utf != 0) {
      uVar2 = 2;
    }
    *lenptr = uVar2;
    ptr_local._4_4_ = 1;
  }
  else if (uVar1 - 0x2028 < 2) {
    *lenptr = 3;
    ptr_local._4_4_ = 1;
  }
  else {
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

BOOL
PRIV(is_newline)(PCRE2_SPTR ptr, uint32_t type, PCRE2_SPTR endptr,
  uint32_t *lenptr, BOOL utf)
{
uint32_t c;

#ifdef SUPPORT_UNICODE
if (utf) { GETCHAR(c, ptr); } else c = *ptr;
#else
(void)utf;
c = *ptr;
#endif  /* SUPPORT_UNICODE */

if (type == NLTYPE_ANYCRLF) switch(c)
  {
  case CHAR_LF:
  *lenptr = 1;
  return TRUE;

  case CHAR_CR:
  *lenptr = (ptr < endptr - 1 && ptr[1] == CHAR_LF)? 2 : 1;
  return TRUE;

  default:
  return FALSE;
  }

/* NLTYPE_ANY */

else switch(c)
  {
#ifdef EBCDIC
  case CHAR_NEL:
#endif
  case CHAR_LF:
  case CHAR_VT:
  case CHAR_FF:
  *lenptr = 1;
  return TRUE;

  case CHAR_CR:
  *lenptr = (ptr < endptr - 1 && ptr[1] == CHAR_LF)? 2 : 1;
  return TRUE;

#ifndef EBCDIC
#if PCRE2_CODE_UNIT_WIDTH == 8
  case CHAR_NEL:
  *lenptr = utf? 2 : 1;
  return TRUE;

  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 3;
  return TRUE;

#else  /* 16-bit or 32-bit code units */
  case CHAR_NEL:
  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 1;
  return TRUE;
#endif
#endif /* Not EBCDIC */

  default:
  return FALSE;
  }
}